

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  sqlite3 *db;
  Schema *pSVar1;
  uint uVar2;
  SrcList *pSVar3;
  ulong uVar4;
  char *pcVar6;
  Schema **ppSVar7;
  ulong uVar5;
  
  pSVar3 = sqlite3SrcListAppend(pParse->db,(SrcList *)0x0,&pStep->target,(Token *)0x0);
  if (pSVar3 == (SrcList *)0x0) {
    return (SrcList *)0x0;
  }
  db = pParse->db;
  pSVar1 = pStep->pTrig->pSchema;
  if (pSVar1 == (Schema *)0x0) {
    uVar5 = 0xfff0bdc0;
  }
  else {
    uVar2 = db->nDb;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
      goto LAB_00168e14;
    }
    ppSVar7 = &db->aDb->pSchema;
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (*ppSVar7 == pSVar1) break;
      uVar4 = uVar4 + 1;
      ppSVar7 = ppSVar7 + 4;
      uVar5 = (ulong)uVar2;
    } while (uVar2 != uVar4);
  }
  uVar2 = (uint)uVar5;
  if (uVar2 != 0 && (int)uVar2 < 2) {
    return pSVar3;
  }
LAB_00168e14:
  pcVar6 = sqlite3DbStrDup(db,db->aDb[uVar2].zName);
  pSVar3->a[(long)pSVar3->nSrc + -1].zDatabase = pcVar6;
  return pSVar3;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(pParse->db, 0, &pStep->target, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    assert( pSrc->a!=0 );
    iDb = sqlite3SchemaToIndex(pParse->db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      sqlite3 *db = pParse->db;
      assert( iDb<pParse->db->nDb );
      pSrc->a[pSrc->nSrc-1].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    }
  }
  return pSrc;
}